

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execNegEa<(moira::Instr)86,(moira::Mode)5,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 addr;
  u32 uVar1;
  u32 uVar2;
  bool error;
  bool local_19;
  
  addr = computeEA<(moira::Mode)5,(moira::Size)2,0ul>(this,opcode & 7);
  uVar1 = readM<(moira::MemSpace)1,(moira::Size)2,128ul>(this,addr,&local_19);
  if (local_19 == false) {
    (this->reg).sr.n = (bool)((byte)(~uVar1 >> 0xf) & 1);
    (this->reg).sr.z = (short)uVar1 == -1;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,addr,~uVar1);
  }
  return;
}

Assistant:

void
Moira::execNegEa(u16 opcode)
{
    int dst = ( _____________xxx(opcode) );
    u32 ea, data;

    if (!readOp<M,S,STD_AE_FRAME>(dst, ea, data)) return;
    
    data = logic<I,S>(data);
    prefetch();

    writeOp<M,S,POLLIPL>(dst, ea, data);
}